

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznonlinanalysis.cpp
# Opt level: O3

void __thiscall
TPZNonLinearAnalysis::ComputeTangent
          (TPZNonLinearAnalysis *this,TPZFMatrix<double> *tangent,TPZVec<double> *coefs,int icase)

{
  TPZStructMatrix *pTVar1;
  long lVar2;
  int64_t iVar3;
  ulong uVar4;
  TPZFMatrix<double> rhs;
  TPZAutoPointer<TPZGuiInterface> local_c8;
  TPZFMatrix<double> local_c0;
  
  iVar3 = TPZCompMesh::NEquations((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh);
  uVar4 = (ulong)(int)iVar3;
  (*(tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (tangent,uVar4,uVar4);
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_c0.fElem = (double *)0x0;
  local_c0.fGiven = (double *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar4;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_c0.fWork.fStore = (double *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  if (iVar3 << 0x20 != 0) {
    local_c0.fElem =
         (double *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | (iVar3 << 0x20) >> 0x1d);
  }
  pTVar1 = ((this->super_TPZLinearAnalysis).super_TPZAnalysis.fStructMatrix.fRef)->fPointer;
  lVar2 = *(long *)(*(long *)pTVar1 + -0x60);
  local_c8.fRef = (TPZReference *)operator_new(0x10);
  ((local_c8.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_c8.fRef)->fPointer = (TPZGuiInterface *)0x0;
  LOCK();
  ((local_c8.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (**(code **)(*(long *)((long)&pTVar1->field_0x0 + lVar2) + 0x48))
            ((long)&pTVar1->field_0x0 + lVar2,tangent,&local_c0);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_c8);
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZNonLinearAnalysis::ComputeTangent(TPZFMatrix<STATE> &tangent, TPZVec<REAL> &coefs, int icase){
	
	int neq = fCompMesh->NEquations();
	tangent.Redim(neq,neq);
	TPZFMatrix<STATE> rhs(neq,1);
	fStructMatrix->Assemble(tangent,rhs,NULL);
}